

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyDropFontElements(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Node **ppNVar1;
  Node **extraout_RDX;
  Node **extraout_RDX_00;
  Node *next;
  Node *local_20;
  
  while (node != (Node *)0x0) {
    local_20 = node->next;
    if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FONT)) {
      ppNVar1 = &node->content;
      node = local_20;
      if (*ppNVar1 != (Node *)0x0) {
        prvTidyDropFontElements(doc,*ppNVar1,pnode);
        pnode = extraout_RDX_00;
      }
    }
    else {
      DiscardContainer(doc,node,&local_20);
      pnode = extraout_RDX;
      node = local_20;
    }
  }
  return;
}

Assistant:

void TY_(DropFontElements)(TidyDocImpl* doc, Node* node, Node **ARG_UNUSED(pnode))
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (nodeIsFONT(node))
        {
            DiscardContainer(doc, node, &next);
            node = next;
            continue;
        }

        if (node->content)
            TY_(DropFontElements)(doc, node->content, &next);

        node = next;
    }
}